

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<char16_t*>
          (BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,char16_t **key,ArenaMemoryDataSummary **value)

{
  long lVar1;
  int iVar2;
  char16_t *pcVar3;
  char16_t cVar4;
  uint uVar5;
  uint uVar6;
  hash_t hVar7;
  DictionaryStats *this_00;
  uint depth;
  
  lVar1 = *(long *)this;
  depth = 0;
  if (lVar1 != 0) {
    pcVar3 = *key;
    cVar4 = *pcVar3;
    if (cVar4 == L'\0') {
      hVar7 = 0x11c9dc5;
    }
    else {
      uVar5 = 0x811c9dc5;
      do {
        pcVar3 = pcVar3 + 1;
        uVar6 = (ushort)cVar4 ^ uVar5;
        uVar5 = uVar6 * 0x1000193;
        cVar4 = *pcVar3;
      } while (cVar4 != L'\0');
      hVar7 = uVar6 * 0x2000326 >> 1;
    }
    hVar7 = PrimePolicy::ModPrime(hVar7,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar5 = *(uint *)(lVar1 + (ulong)hVar7 * 4);
    depth = 0;
    if (-1 < (int)uVar5) {
      lVar1 = *(long *)(this + 8);
      depth = 0;
      do {
        iVar2 = PAL_wcscmp(*(char16_t **)(lVar1 + 0x10 + (ulong)uVar5 * 0x18),*key);
        if (iVar2 == 0) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_00369003;
        }
        depth = depth + 1;
        uVar5 = *(uint *)(lVar1 + (ulong)uVar5 * 0x18 + 8);
      } while (-1 < (int)uVar5);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar5 = 0xffffffff;
LAB_00369003:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  if (-1 < (int)uVar5) {
    *value = *(ArenaMemoryDataSummary **)(*(long *)(this + 8) + (ulong)uVar5 * 0x18);
  }
  return -1 < (int)uVar5;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }